

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Render(void)

{
  ImDrawDataBuilder *out_list;
  uint uVar1;
  ImGuiWindow *window;
  ImDrawList *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiWindow *pIVar4;
  int iVar5;
  ImGuiWindow **ppIVar6;
  ImGuiIO *pIVar7;
  int n;
  int iVar8;
  ImDrawList **ppIVar9;
  ulong uVar10;
  ImGuiWindow *pIVar11;
  int n_1;
  long lVar12;
  ImGuiWindow *windows_to_render_front_most [2];
  ImGuiWindow *local_48 [3];
  
  pIVar3 = GImGui;
  if (GImGui->Initialized != false) {
    iVar8 = GImGui->FrameCountEnded;
    if (iVar8 != GImGui->FrameCount) {
      EndFrame();
      iVar8 = pIVar3->FrameCount;
    }
    pIVar3->FrameCountRendered = iVar8;
    (pIVar3->IO).MetricsRenderWindows = 0;
    (pIVar3->IO).MetricsRenderVertices = 0;
    (pIVar3->IO).MetricsRenderIndices = 0;
    out_list = &pIVar3->DrawDataBuilder;
    ImDrawDataBuilder::Clear(out_list);
    if ((pIVar3->BackgroundDrawList).VtxBuffer.Size != 0) {
      AddDrawListToDrawData(out_list->Layers,&pIVar3->BackgroundDrawList);
    }
    pIVar11 = pIVar3->NavWindowingTarget;
    if (pIVar11 == (ImGuiWindow *)0x0) {
      local_48[0] = (ImGuiWindow *)0x0;
      pIVar11 = (ImGuiWindow *)0x0;
    }
    else {
      if ((pIVar11->Flags & 0x2000) == 0) {
        local_48[0] = pIVar11->RootWindow;
      }
      else {
        local_48[0] = (ImGuiWindow *)0x0;
      }
      pIVar11 = pIVar3->NavWindowingList;
    }
    pIVar4 = local_48[0];
    local_48[1] = pIVar11;
    for (iVar8 = 0; iVar8 != (pIVar3->Windows).Size; iVar8 = iVar8 + 1) {
      ppIVar6 = ImVector<ImGuiWindow_*>::operator[](&pIVar3->Windows,iVar8);
      window = *ppIVar6;
      if (((window->Active == true) && (window->Hidden == false)) &&
         ((window != pIVar11 && window != pIVar4) && (window->Flags & 0x1000000) == 0)) {
        AddRootWindowToDrawData(window);
      }
    }
    for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
      pIVar11 = local_48[lVar12];
      if (((pIVar11 != (ImGuiWindow *)0x0) && (pIVar11->Active == true)) &&
         (pIVar11->Hidden == false)) {
        AddRootWindowToDrawData(pIVar11);
      }
    }
    ImDrawDataBuilder::FlattenIntoSingleLayer(out_list);
    if ((pIVar3->IO).MouseDrawCursor != false) {
      RenderMouseCursor(&pIVar3->ForegroundDrawList,(pIVar3->IO).MousePos,
                        (pIVar3->Style).MouseCursorScale,pIVar3->MouseCursor);
    }
    if ((pIVar3->ForegroundDrawList).VtxBuffer.Size != 0) {
      AddDrawListToDrawData(out_list->Layers,&pIVar3->ForegroundDrawList);
    }
    pIVar7 = GetIO();
    (pIVar3->DrawData).Valid = true;
    uVar1 = (pIVar3->DrawDataBuilder).Layers[0].Size;
    iVar8 = 0;
    if ((int)uVar1 < 1) {
      ppIVar9 = (ImDrawList **)0x0;
    }
    else {
      ppIVar9 = (pIVar3->DrawDataBuilder).Layers[0].Data;
    }
    (pIVar3->DrawData).CmdLists = ppIVar9;
    (pIVar3->DrawData).CmdListsCount = uVar1;
    (pIVar3->DrawData).TotalIdxCount = 0;
    (pIVar3->DrawData).TotalVtxCount = 0;
    (pIVar3->DrawData).DisplayPos.x = 0.0;
    (pIVar3->DrawData).DisplayPos.y = 0.0;
    (pIVar3->DrawData).DisplaySize = pIVar7->DisplaySize;
    (pIVar3->DrawData).FramebufferScale = pIVar7->DisplayFramebufferScale;
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    iVar5 = 0;
    for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
      pIVar2 = (pIVar3->DrawDataBuilder).Layers[0].Data[uVar10];
      iVar5 = iVar5 + (pIVar2->VtxBuffer).Size;
      (pIVar3->DrawData).TotalVtxCount = iVar5;
      iVar8 = iVar8 + (pIVar2->IdxBuffer).Size;
      (pIVar3->DrawData).TotalIdxCount = iVar8;
    }
    (pIVar3->IO).MetricsRenderVertices = iVar5;
    (pIVar3->IO).MetricsRenderIndices = iVar8;
    return;
  }
  __assert_fail("g.Initialized",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.cpp"
                ,0xf6c,"void ImGui::Render()");
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;

    // Gather ImDrawList to render (for each active window)
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsRenderWindows = 0;
    g.DrawDataBuilder.Clear();
    if (!g.BackgroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.BackgroundDrawList);

    ImGuiWindow* windows_to_render_front_most[2];
    windows_to_render_front_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_front_most[1] = g.NavWindowingTarget ? g.NavWindowingList : NULL;
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_front_most[0] && window != windows_to_render_front_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_front_most); n++)
        if (windows_to_render_front_most[n] && IsWindowActiveAndVisible(windows_to_render_front_most[n])) // NavWindowingTarget is always temporarily displayed as the front-most window
            AddRootWindowToDrawData(windows_to_render_front_most[n]);
    g.DrawDataBuilder.FlattenIntoSingleLayer();

    // Draw software mouse cursor if requested
    if (g.IO.MouseDrawCursor)
        RenderMouseCursor(&g.ForegroundDrawList, g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor);

    if (!g.ForegroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.ForegroundDrawList);

    // Setup ImDrawData structure for end-user
    SetupDrawData(&g.DrawDataBuilder.Layers[0], &g.DrawData);
    g.IO.MetricsRenderVertices = g.DrawData.TotalVtxCount;
    g.IO.MetricsRenderIndices = g.DrawData.TotalIdxCount;

    // (Legacy) Call the Render callback function. The current prefer way is to let the user retrieve GetDrawData() and call the render function themselves.
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (g.DrawData.CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
        g.IO.RenderDrawListsFn(&g.DrawData);
#endif
}